

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O2

StatusCode __thiscall HttpConn::processRequest(HttpConn *this)

{
  string *psVar1;
  Method MVar2;
  bool bVar3;
  bool bVar4;
  StatusCode SVar5;
  int iVar6;
  __pid_t __pid;
  iterator iVar7;
  mapped_type *pmVar8;
  LogStream *this_00;
  long lVar9;
  ssize_t sVar10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar11;
  undefined1 local_10b0 [8];
  string name;
  key_type local_d8;
  undefined1 local_b8 [8];
  char res [20];
  undefined1 local_98 [8];
  string sum;
  string path;
  string pwd;
  uint local_30;
  uint local_2c;
  int pipefd [2];
  
  std::__cxx11::string::string
            ((string *)local_10b0,"Connection",(allocator *)(path.field_2._M_local_buf + 8));
  pmVar11 = &this->headers_;
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&pmVar11->_M_t,(key_type *)local_10b0);
  std::__cxx11::string::~string((string *)local_10b0);
  if ((_Rb_tree_header *)iVar7._M_node != &(this->headers_)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string
              ((string *)local_10b0,"Connection",(allocator *)(sum.field_2._M_local_buf + 8));
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar11,(key_type *)local_10b0);
    bVar3 = std::operator==(pmVar8,"keep-alive");
    if (bVar3) {
      std::__cxx11::string::~string((string *)local_10b0);
    }
    else {
      std::__cxx11::string::string
                ((string *)(path.field_2._M_local_buf + 8),"Connection",(allocator *)local_98);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar11,(key_type *)((long)&path.field_2 + 8));
      bVar3 = std::operator==(pmVar8,"Keep-Alive");
      std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_10b0);
      if (!bVar3) goto LAB_00120faa;
    }
    this->linger_ = true;
  }
LAB_00120faa:
  std::__cxx11::string::string
            ((string *)local_10b0,"Connection",(allocator *)(path.field_2._M_local_buf + 8));
  pmVar11 = &this->outputHeaders_;
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar11,(key_type *)local_10b0);
  std::__cxx11::string::assign((char *)pmVar8);
  std::__cxx11::string::~string((string *)local_10b0);
  MVar2 = this->method_;
  if (MVar2 == Get) {
    psVar1 = &this->path_;
    bVar3 = std::operator==(psVar1,"/hello");
    if (!bVar3) {
      bVar3 = std::operator==(psVar1,"/");
      if (bVar3) {
        std::__cxx11::string::assign((char *)psVar1);
      }
      SVar5 = handleFile(this,psVar1);
      return SVar5;
    }
    std::__cxx11::string::assign((char *)&this->body_);
    std::__cxx11::string::string
              ((string *)local_10b0,"Content-Type",(allocator *)(path.field_2._M_local_buf + 8));
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar11,(key_type *)local_10b0);
    std::__cxx11::string::assign((char *)pmVar8);
LAB_001212fe:
    std::__cxx11::string::~string((string *)local_10b0);
    return OK;
  }
  if (MVar2 != Post) {
    if (MVar2 == Head) {
      Logger::Logger((Logger *)local_10b0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/HttpConn.cpp"
                     ,0x136);
      this_00 = LogStream::operator<<((LogStream *)local_10b0,"Processing HEAD request from ");
      LogStream::operator<<(this_00,&this->from_);
      Logger::~Logger((Logger *)local_10b0);
      return OK;
    }
    return BadRequest;
  }
  psVar1 = &this->path_;
  bVar3 = std::operator==(psVar1,"/signup");
  if ((bVar3) || (bVar3 = std::operator==(psVar1,"/login"), bVar3)) {
    std::__cxx11::string::string
              ((string *)local_10b0,"Content-Type",(allocator *)(path.field_2._M_local_buf + 8));
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar11,(key_type *)local_10b0);
    std::__cxx11::string::assign((char *)pmVar8);
    std::__cxx11::string::~string((string *)local_10b0);
    std::__cxx11::string::string
              ((string *)(path.field_2._M_local_buf + 8),"username",
               (allocator *)(sum.field_2._M_local_buf + 8));
    findInBody((string *)local_10b0,this,(string *)((long)&path.field_2 + 8));
    std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
    std::__cxx11::string::string
              ((string *)(sum.field_2._M_local_buf + 8),"password",(allocator *)local_98);
    findInBody((string *)((long)&path.field_2 + 8),this,(string *)((long)&sum.field_2 + 8));
    std::__cxx11::string::~string((string *)(sum.field_2._M_local_buf + 8));
    bVar3 = WebServer::existUser(this->server_,(string *)local_10b0);
    bVar4 = std::operator==(psVar1,"/signup");
    if (bVar4) {
      if (!bVar3) {
        WebServer::updateUser
                  (this->server_,(string *)local_10b0,(string *)((long)&path.field_2 + 8));
      }
      std::__cxx11::string::assign((char *)&this->body_);
    }
    bVar4 = std::operator==(psVar1,"/login");
    if (bVar4) {
      if (bVar3) {
        WebServer::verifyUser
                  (this->server_,(string *)local_10b0,(string *)((long)&path.field_2 + 8));
      }
      std::__cxx11::string::assign((char *)&this->body_);
    }
    std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
    goto LAB_001212fe;
  }
  lVar9 = std::__cxx11::string::find((char *)psVar1,0x12ac31);
  if ((lVar9 == -1) || (lVar9 = std::__cxx11::string::find((char *)psVar1,0x12ac36), lVar9 == -1))
  goto LAB_0012151d;
  iVar6 = pipe((int *)&local_30);
  if (iVar6 != 0) {
    return InternalError;
  }
  std::__cxx11::string::string
            ((string *)(path.field_2._M_local_buf + 8),"x",
             (allocator *)(sum.field_2._M_local_buf + 8));
  findInBody((string *)local_10b0,this,(string *)((long)&path.field_2 + 8));
  std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sum.field_2._M_local_buf + 8),"y",(allocator *)local_98);
  findInBody((string *)((long)&path.field_2 + 8),this,(string *)((long)&sum.field_2 + 8));
  std::__cxx11::string::~string((string *)(sum.field_2._M_local_buf + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 &root_abi_cxx11_,"/..");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&sum.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 psVar1);
  std::__cxx11::string::~string((string *)local_98);
  __pid = fork();
  if (__pid < 0) {
LAB_001214b5:
    pmVar11 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x1f4;
LAB_001214bb:
    bVar3 = false;
  }
  else {
    if (__pid != 0) {
      ::close(local_2c);
      sVar10 = ::read(local_30,local_b8,1);
      if (sVar10 < 0) goto LAB_001214b5;
      local_98 = (undefined1  [8])&sum._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,local_b8,local_b8 + -(sVar10 >> 0x3f));
      std::__cxx11::string::_M_assign((string *)&this->body_);
      printf("%d %d %d\n",(ulong)local_30,(ulong)local_2c,-(sVar10 >> 0x3f) & 0xffffffff);
      std::__cxx11::string::string
                ((string *)&local_d8,"Content-Type",(allocator *)(pwd.field_2._M_local_buf + 0xf));
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar11,&local_d8);
      std::__cxx11::string::assign((char *)pmVar8);
      std::__cxx11::string::~string((string *)&local_d8);
      waitpid(__pid,(int *)0x0,0);
      ::close(local_30);
      std::__cxx11::string::~string((string *)local_98);
      pmVar11 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)0xc8;
      goto LAB_001214bb;
    }
    ::close(local_30);
    dup2(local_2c,1);
    ::close(local_2c);
    execl((char *)sum.field_2._8_8_,(char *)local_10b0,path.field_2._8_8_,0);
    bVar3 = true;
  }
  std::__cxx11::string::~string((string *)(sum.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_10b0);
  if (!bVar3) {
    return (StatusCode)pmVar11;
  }
LAB_0012151d:
  std::__cxx11::string::string
            ((string *)local_10b0,"./404.html",(allocator *)(path.field_2._M_local_buf + 8));
  handleFile(this,(string *)local_10b0);
  std::__cxx11::string::~string((string *)local_10b0);
  return NotFound;
}

Assistant:

HttpConn::StatusCode HttpConn::processRequest() {
    if (headers_.find("Connection") != headers_.end()) {
        if (headers_["Connection"] == "keep-alive" || headers_["Connection"] == "Keep-Alive") {
            linger_ = true;
        } 
    }
    outputHeaders_["Connection"] = linger_ ? "keep-alive" : "close";
    if (method_ == Head) {
        LOG << "Processing HEAD request from " << from_;
        return OK;
    } else if (method_ == Get) {
        if (path_ == "/hello") {
            body_ = "Hello World";
            outputHeaders_["Content-Type"] = "text/plain";
            return OK;
        }
        if (path_ == "/")
            path_ = "/index.html";
        // LOG << "Processing GET request from " << from_ << ": get " << path_;
        return handleFile(path_);
    } else if (method_ == Post) {
        if (path_ == "/signup" || path_ == "/login") {
            
            outputHeaders_["Content-Type"] = "text/plain";
            std::string name = findInBody("username");
            std::string pwd = findInBody("password");
            bool exist = server_->existUser(name);
            if (path_ == "/signup") {
                if (exist) body_ = "Username Exists!";
                else {
                    server_->updateUser(name, pwd);
                    body_ = "Successful signup!";
                }
            }
            if (path_ == "/login") {
                if (!exist || !server_->verifyUser(name, pwd)) body_ = "Wrong username or wrong password";
                else body_ = "Successful login!";
            }

            return OK;
        }
        //issue: pipe does not work
        if (path_.find("/cgi") != path_.npos) {
            if (path_.find("/add") != path_.npos) {
                pid_t pid;
                int pipefd[2];
                if (pipe(pipefd) != 0) 
                    return InternalError;
                std::string x = findInBody("x");
                std::string y = findInBody("y");
                std::string path = root + "/.." + path_;
                if ((pid = fork()) < 0) {
                    return InternalError;
                } else if (pid == 0) {
                    ::close(pipefd[0]);
                    dup2(pipefd[1], STDOUT_FILENO);
                    ::close(pipefd[1]);
                    execl(path.c_str(), x.c_str(), y.c_str(), NULL);
                } else {
                    ::close(pipefd[1]);
                    char res[20];
                    int len;
                    if ((len = ::read(pipefd[0], res, 1) < 0)) {
                        return InternalError; 
                    }
                    std::string sum(res, res + len);
                    body_ = sum;
                    printf("%d %d %d\n",pipefd[0], pipefd[1], len);
                    outputHeaders_["Content-Type"] = "text/plain";
                    waitpid(pid, NULL, 0);
                    ::close(pipefd[0]);
                    return OK;
                }
            }
        }
        handleFile("./404.html");
        return NotFound;

    }
    return BadRequest;
}